

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O3

void google::FlushLogFilesUnsafe(LogSeverity min_severity)

{
  undefined8 *puVar1;
  int i;
  long lVar2;
  
  if (min_severity < 4) {
    lVar2 = (long)min_severity;
    puVar1 = &LogDestination::log_destinations_ + lVar2;
    do {
      lVar2 = lVar2 + 1;
      if ((LogFileObject *)*puVar1 != (LogFileObject *)0x0) {
        anon_unknown_10::LogFileObject::FlushUnlocked((LogFileObject *)*puVar1);
      }
      puVar1 = puVar1 + 1;
    } while ((int)lVar2 != 4);
  }
  return;
}

Assistant:

inline void LogDestination::FlushLogFilesUnsafe(int min_severity) {
  // assume we have the log_mutex or we simply don't care
  // about it
  for (int i = min_severity; i < NUM_SEVERITIES; i++) {
    LogDestination* log = log_destinations_[i];
    if (log != NULL) {
      // Flush the base fileobject_ logger directly instead of going
      // through any wrappers to reduce chance of deadlock.
      log->fileobject_.FlushUnlocked();
    }
  }
}